

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O0

_Bool read_stdin(void *buffer,size_t nbytes)

{
  int filedes;
  size_t sVar1;
  ssize_t nread;
  size_t nbytes_local;
  void *buffer_local;
  
  filedes = fileno(_stdin);
  sVar1 = fullread(filedes,buffer,nbytes);
  if (sVar1 != nbytes) {
    logmsg("exiting...");
  }
  return sVar1 == nbytes;
}

Assistant:

static bool read_stdin(void *buffer, size_t nbytes)
{
  ssize_t nread = fullread(fileno(stdin), buffer, nbytes);
  if(nread != (ssize_t)nbytes) {
    logmsg("exiting...");
    return FALSE;
  }
  return TRUE;
}